

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O3

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::writeField(Field<OpenMD::Vector3<double>_> *this)

{
  char cVar1;
  ostream *poVar2;
  double (*padVar3) [3];
  pointer pvVar4;
  uint i;
  long lVar5;
  pointer pvVar6;
  uint j;
  long lVar7;
  pointer pvVar8;
  pointer pVVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  pointer pcVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  Revision r;
  ofstream fs;
  Mat3x3d hmat;
  Revision local_309;
  string local_308;
  long local_2e0;
  double local_2d8;
  double local_2d0;
  undefined8 local_2c8 [4];
  double local_2a8 [4];
  double local_288;
  double dStack_280;
  long local_278;
  filebuf local_270 [240];
  ios_base local_180 [264];
  Mat3x3d local_78;
  
  Snapshot::getHmat(&local_78,((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_);
  local_2a8[0] = 0.0;
  local_2a8[1] = 0.0;
  local_2a8[2] = 0.0;
  std::ofstream::ofstream
            (&local_278,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"# ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_278,
                        (this->super_StaticAnalyser).analysisType_._M_dataplus._M_p,
                        (this->super_StaticAnalyser).analysisType_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_308,&local_309);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_278,local_308._M_dataplus._M_p,local_308._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_308,&local_309);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_278,local_308._M_dataplus._M_p,local_308._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"# selection script: \"",0x15);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_278,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"#\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,
               "# Vector Field output file format has coordinates of the center\n",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,
               "# of the voxel followed by the value of field (either vector or\n",0x40);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"# scalar).\n",0xb);
    pvVar4 = (this->field_).
             super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (pvVar4->
             super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pVVar9 = (pvVar6->
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pvVar6->
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish != pVVar9) {
      local_2e0 = 0;
      uVar10 = 0;
      do {
        auVar15._8_4_ = (int)(uVar10 >> 0x20);
        auVar15._0_8_ = uVar10;
        auVar15._12_4_ = 0x45300000;
        local_2a8[2] = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0)) /
                       (double)(this->nBins_).super_Vector<int,_3U>.data_[2] + -0.5;
        if ((pvVar4->
            super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish != pvVar6) {
          pvVar8 = (this->field_).
                   super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar12 = 0;
          do {
            auVar16._8_4_ = (int)(uVar12 >> 0x20);
            auVar16._0_8_ = uVar12;
            auVar16._12_4_ = 0x45300000;
            dVar17 = auVar16._8_8_ - 1.9342813113834067e+25;
            bVar13 = pvVar8 != pvVar4;
            pvVar8 = pvVar4;
            if (bVar13) {
              local_288 = dVar17 + ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
              uVar11 = 0;
              dStack_280 = dVar17;
              do {
                local_2a8[1] = local_288 / (double)(this->nBins_).super_Vector<int,_3U>.data_[1] +
                               -0.5;
                local_308._M_dataplus._M_p = (char *)0x0;
                local_308._M_string_length = 0;
                local_308.field_2._M_allocated_capacity = 0;
                padVar3 = (double (*) [3])&local_78;
                lVar5 = 0;
                do {
                  pcVar14 = (&local_308._M_dataplus)[lVar5]._M_p;
                  lVar7 = 0;
                  do {
                    pcVar14 = (pointer)((double)pcVar14 +
                                       (((SquareMatrix<double,_3> *)*padVar3)->
                                       super_RectMatrix<double,_3U,_3U>).data_[0][lVar7] *
                                       local_2a8[lVar7]);
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 3);
                  (&local_308._M_dataplus)[lVar5]._M_p = pcVar14;
                  lVar5 = lVar5 + 1;
                  padVar3 = padVar3 + 1;
                } while (lVar5 != 3);
                local_2d0 = (double)local_308._M_string_length;
                local_2d8 = (double)local_308.field_2._M_allocated_capacity;
                poVar2 = std::ostream::_M_insert<double>((double)local_308._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
                poVar2 = std::ostream::_M_insert<double>(local_2d0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
                poVar2 = std::ostream::_M_insert<double>(local_2d8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
                lVar5 = *(long *)(*(long *)&(this->field_).
                                            super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                            super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data + uVar12 * 0x18);
                local_2c8[0] = 0;
                local_2c8[1] = 0;
                local_2c8[2] = 0;
                if (local_2c8 != (undefined8 *)(lVar5 + uVar10 * 0x18)) {
                  lVar7 = 0;
                  do {
                    local_2c8[lVar7] = *(undefined8 *)(lVar5 + local_2e0 + lVar7 * 8);
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 3);
                }
                (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[8])(&local_308,this,local_2c8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_278,local_308._M_dataplus._M_p,
                           local_308._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p != &local_308.field_2) {
                  operator_delete(local_308._M_dataplus._M_p,
                                  local_308.field_2._M_allocated_capacity + 1);
                }
                cVar1 = (char)(ostream *)&local_278;
                std::ios::widen((char)*(undefined8 *)(local_278 + -0x18) + cVar1);
                std::ostream::put(cVar1);
                std::ostream::flush();
                uVar11 = uVar11 + 1;
                pvVar4 = (this->field_).
                         super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pvVar8 = (this->field_).
                         super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              } while (uVar11 < (ulong)(((long)pvVar8 - (long)pvVar4 >> 3) * -0x5555555555555555));
              pvVar6 = (pvVar4->
                       super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < (ulong)(((long)(pvVar4->
                                           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pvVar6 >> 3) * -0x5555555555555555));
          pVVar9 = (pvVar6->
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
        uVar10 = uVar10 + 1;
        local_2e0 = local_2e0 + 0x18;
      } while (uVar10 < (ulong)(((long)(pvVar6->
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9 >>
                                3) * -0x5555555555555555));
    }
  }
  local_278 = _VTT;
  *(undefined8 *)(local_270 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_270);
  std::ios_base::~ios_base(local_180);
  return;
}

Assistant:

void Field<T>::writeField() {
    Mat3x3d hmat = info_->getSnapshotManager()->getCurrentSnapshot()->getHmat();
    Vector3d scaled(0.0);

    std::ofstream fs(outputFilename_.c_str());
    if (fs.is_open()) {
      Revision r;
      fs << "# " << getAnalysisType() << "\n";
      fs << "# OpenMD " << r.getFullRevision() << "\n";
      fs << "# " << r.getBuildDate() << "\n";
      fs << "# selection script: \"" << selectionScript_ << "\"\n";
      fs << "#\n";
      fs << "# Vector Field output file format has coordinates of the center\n";
      fs << "# of the voxel followed by the value of field (either vector or\n";
      fs << "# scalar).\n";

      for (std::size_t k = 0; k < field_[0][0].size(); ++k) {
        scaled.z() = RealType(k) / nBins_.z() - 0.5;
        for (std::size_t j = 0; j < field_[0].size(); ++j) {
          scaled.y() = RealType(j) / nBins_.y() - 0.5;
          for (std::size_t i = 0; i < field_.size(); ++i) {
            scaled.y() = RealType(j) / nBins_.y() - 0.5;

            Vector3d voxelLoc = hmat * scaled;

            fs << voxelLoc.x() << "\t";
            fs << voxelLoc.y() << "\t";
            fs << voxelLoc.z() << "\t";

            fs << writeValue(field_[i][j][k]);

            fs << std::endl;
          }
        }
      }
    }
  }